

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O0

void RigidBodyDynamics::CompositeRigidBodyAlgorithm
               (Model *model,VectorNd *Q,MatrixNd *H,bool update_kinematics)

{
  Scalar SVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  Scalar *pSVar7;
  byte in_CL;
  long in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ReturnType RVar8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  PVar9;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>
  PVar10;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar11;
  MatrixNd H_temp2_7;
  uint dof_2;
  uint k_2;
  MatrixNd H_temp2_6;
  MatrixNd H_temp2_5;
  uint dof_index_j_2;
  uint j_2;
  MatrixNd F_Nd;
  uint dofI;
  uint kI;
  MatrixNd H_temp2_4;
  uint dof_1;
  uint k_1;
  Matrix3d H_temp2_3;
  Vector3d H_temp2_2;
  uint dof_index_j_1;
  uint j_1;
  Matrix63 F_63;
  VectorNd H_temp2_1;
  uint dof;
  uint k;
  Vector3d H_temp2;
  uint dof_index_j;
  uint j;
  SpatialVector F;
  uint dof_index_i;
  uint i_1;
  uint i;
  SpatialRigidBodyInertia *in_stack_fffffffffffff178;
  TransposeReturnType in_stack_fffffffffffff180;
  RhsNested in_stack_fffffffffffff188;
  LhsNested in_stack_fffffffffffff190;
  undefined1 *in_stack_fffffffffffff1a0;
  long in_stack_fffffffffffff1a8;
  ulong in_stack_fffffffffffff1b0;
  ulong in_stack_fffffffffffff1b8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff1c0;
  LhsNested in_stack_fffffffffffff200;
  TransposeReturnType in_stack_fffffffffffff208;
  SpatialRigidBodyInertia *in_stack_fffffffffffff328;
  SpatialVector *in_stack_fffffffffffff340;
  SpatialTransform *in_stack_fffffffffffff348;
  SpatialTransform *in_stack_fffffffffffff380;
  SpatialVector *in_stack_fffffffffffff3a0;
  SpatialRigidBodyInertia *in_stack_fffffffffffff3a8;
  undefined1 local_ba8 [80];
  non_const_type local_b58;
  non_const_type local_b18;
  non_const_type local_b10;
  SpatialRigidBodyInertia *in_stack_fffffffffffff4f8;
  SpatialTransform *in_stack_fffffffffffff500;
  uint local_9ac;
  uint local_4c4;
  uint local_10c;
  VectorNd *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  Model *in_stack_ffffffffffffffa8;
  uint local_24;
  uint local_20;
  
  for (local_20 = 1;
      sVar4 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_20 < sVar4;
      local_20 = local_20 + 1) {
    if ((in_CL & 1) != 0) {
      jcalc_X_lambda_S(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98
                      );
    }
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  *)(in_RDI + 0x1b),(ulong)local_20);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  *)(in_RDI + 0x1c),(ulong)local_20);
    Math::SpatialRigidBodyInertia::operator=
              ((SpatialRigidBodyInertia *)in_stack_fffffffffffff180.m_matrix,
               in_stack_fffffffffffff178);
  }
  sVar4 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)&in_RDI[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  PVar11.m_rhs = in_stack_fffffffffffff188;
  PVar11.m_lhs.m_matrix = in_stack_fffffffffffff190.m_matrix;
  local_24 = (uint)sVar4;
  while (local_24 = local_24 - 1, local_24 != 0) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_24);
    if (*pvVar5 != 0) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_24);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1c),(ulong)*pvVar5);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(in_RDI + 0x1f),(ulong)local_24);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1c),(ulong)local_24);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      Math::SpatialRigidBodyInertia::operator+
                ((SpatialRigidBodyInertia *)in_stack_fffffffffffff208.m_matrix,
                 (SpatialRigidBodyInertia *)in_stack_fffffffffffff200.m_matrix);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_24);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1c),(ulong)*pvVar5);
      Math::SpatialRigidBodyInertia::operator=
                ((SpatialRigidBodyInertia *)in_stack_fffffffffffff180.m_matrix,
                 in_stack_fffffffffffff178);
    }
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    uVar2 = pvVar6->q_index;
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    if ((pvVar6->mDoFCount == 1) &&
       (pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24)
       , pvVar6->mJointType != JointTypeCustom)) {
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1c),(ulong)local_24);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
              dot<Eigen::Matrix<double,6,1,0,6,1>>
                        ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffff178);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffff180.m_matrix,(Index)in_stack_fffffffffffff178,
                          0x819053);
      *pSVar7 = RVar8;
      local_10c = local_24;
      while (pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (in_RDI,(ulong)local_10c), *pvVar5 != 0) {
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1f),(ulong)local_10c);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff348,in_stack_fffffffffffff340);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff180.m_matrix,
                   (SpatialVector_t *)in_stack_fffffffffffff178);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RDI,(ulong)local_10c);
        local_10c = *pvVar5;
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10c);
        pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10c
                             );
        if (pvVar6->mJointType == JointTypeCustom) {
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_10c);
          if (pvVar6->mJointType == JointTypeCustom) {
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_10c);
            uVar2 = pvVar6->custom_joint_index;
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
            Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff178
                      );
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&in_RDI[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
            Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                       in_stack_fffffffffffff180.m_matrix,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffff178);
            Eigen::
            DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
            ::transpose((DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                         *)0x819452);
            Eigen::Matrix<double,-1,1,0,-1,1>::
            Matrix<Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
                      ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff180.m_matrix,
                       (EigenBase<Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
                        *)in_stack_fffffffffffff178);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffff178);
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                      (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0
                       ,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                       (uint)in_stack_fffffffffffff1a8);
            Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                       in_stack_fffffffffffff180.m_matrix,
                       (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                       in_stack_fffffffffffff178);
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                      (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0
                       ,(uint)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                       (int)in_stack_fffffffffffff1a8);
            Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                       in_stack_fffffffffffff180.m_matrix,
                       (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffff178);
            Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                      ((Matrix<double,__1,_1,_0,__1,_1> *)0x81954f);
          }
        }
        else {
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_10c);
          if (pvVar6->mDoFCount == 1) {
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10c);
            RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
                    dot<Eigen::Matrix<double,6,1,0,6,1>>
                              ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                               in_stack_fffffffffffff180.m_matrix,
                               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                               in_stack_fffffffffffff178);
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                                in_stack_fffffffffffff180.m_matrix,(Index)in_stack_fffffffffffff178,
                                0x8191ce);
            *pSVar7 = RVar8;
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                                in_stack_fffffffffffff180.m_matrix,(Index)in_stack_fffffffffffff178,
                                0x8191fa);
            SVar1 = *pSVar7;
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                                in_stack_fffffffffffff180.m_matrix,(Index)in_stack_fffffffffffff178,
                                0x819226);
            *pSVar7 = SVar1;
          }
          else {
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_10c);
            if (pvVar6->mDoFCount == 3) {
              Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffff178);
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)&in_RDI[0xe].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_10c);
              Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                         in_stack_fffffffffffff178);
              Eigen::
              DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
              ::transpose((DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                           *)0x8192be);
              Vector3_t::
              Vector3_t<Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>,Eigen::Matrix<double,6,3,0,6,3>,0>const>>
                        ((Vector3_t *)in_stack_fffffffffffff180.m_matrix,
                         (MatrixBase<Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>_>
                          *)in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                         (Index)in_stack_fffffffffffff180.m_matrix);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                         in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                         (Index)in_stack_fffffffffffff180.m_matrix);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,1,false>::operator=
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff178);
            }
          }
        }
      }
    }
    else {
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&in_RDI[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      if ((pvVar6->mDoFCount == 3) &&
         (pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_24), pvVar6->mJointType != JointTypeCustom)) {
        std::
        vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                      *)(in_RDI + 0x1c),(ulong)local_24);
        Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffff328);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                   in_stack_fffffffffffff180.m_matrix,
                   (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffff178);
        Eigen::Matrix<double,6,3,0,6,3>::
        Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                  ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff180.m_matrix,
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                    *)in_stack_fffffffffffff178);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffff178);
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                  ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                   in_stack_fffffffffffff180.m_matrix,
                   (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffff178);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                   (Index)in_stack_fffffffffffff180.m_matrix);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,3,false>::operator=
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)
                   in_stack_fffffffffffff180.m_matrix,
                   (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                    *)in_stack_fffffffffffff178);
        local_4c4 = local_24;
        while (pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (in_RDI,(ulong)local_4c4), *pvVar5 != 0) {
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(in_RDI + 0x1f),(ulong)local_4c4);
          Math::SpatialTransform::toMatrixTranspose(in_stack_fffffffffffff380);
          Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                     in_stack_fffffffffffff180.m_matrix,
                     (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffff178)
          ;
          Eigen::Matrix<double,6,3,0,6,3>::operator=
                    ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff180.m_matrix,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                      *)in_stack_fffffffffffff178);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_RDI,(ulong)local_4c4);
          local_4c4 = *pvVar5;
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_4c4);
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_4c4);
          if (pvVar6->mJointType == JointTypeCustom) {
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_4c4);
            if (pvVar6->mJointType == JointTypeCustom) {
              pvVar6 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)&in_RDI[6].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)local_4c4);
              uVar2 = pvVar6->custom_joint_index;
              std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)&in_RDI[0x13].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
              Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                         in_stack_fffffffffffff178);
              std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)&in_RDI[0x13].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
              Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff178);
              Eigen::Matrix<double,-1,-1,0,-1,-1>::
              Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                        (in_stack_fffffffffffff180.m_matrix,
                         (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                          *)in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                        (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                         in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                         (uint)in_stack_fffffffffffff1a8);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                        (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                         in_stack_fffffffffffff1b0,(uint)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                         (int)in_stack_fffffffffffff1a8);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                         in_stack_fffffffffffff178);
              Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                        ((Matrix<double,__1,__1,_0,__1,__1> *)0x819be2);
            }
          }
          else {
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_4c4);
            if (pvVar6->mDoFCount == 1) {
              Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                         in_stack_fffffffffffff178);
              std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                        ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                         &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_4c4);
              Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffff178);
              Vector3_t::
              Vector3_t<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                        ((Vector3_t *)in_stack_fffffffffffff180.m_matrix,
                         (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                          *)in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                         (Index)in_stack_fffffffffffff180.m_matrix);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,1,false>::operator=
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff178);
              Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                         (Index)in_stack_fffffffffffff180.m_matrix);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
                         in_stack_fffffffffffff180.m_matrix,
                         (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                         in_stack_fffffffffffff178);
            }
            else {
              pvVar6 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)&in_RDI[6].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)local_4c4);
              if (pvVar6->mDoFCount == 3) {
                Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                           in_stack_fffffffffffff178);
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)&in_RDI[0xe].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_4c4)
                ;
                Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                           in_stack_fffffffffffff178);
                Matrix3_t::
                Matrix3_t<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                          ((Matrix3_t *)in_stack_fffffffffffff180.m_matrix,
                           (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                            *)in_stack_fffffffffffff178);
                Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                           (Index)in_stack_fffffffffffff180.m_matrix);
                Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,3,false>::operator=
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff178);
                Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff178);
                Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           PVar11.m_lhs.m_matrix.m_matrix,(Index)PVar11.m_rhs,
                           (Index)in_stack_fffffffffffff180.m_matrix);
                Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,3,false>::operator=
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                           in_stack_fffffffffffff178);
              }
            }
          }
        }
      }
      else {
        pvVar6 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24)
        ;
        if (pvVar6->mJointType == JointTypeCustom) {
          pvVar6 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&in_RDI[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_24);
          uVar3 = pvVar6->custom_joint_index;
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          std::
          vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                        *)(in_RDI + 0x1c),(ulong)local_24);
          Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffff328);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                     in_stack_fffffffffffff180.m_matrix,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffff178);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                    (in_stack_fffffffffffff180.m_matrix,
                     (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                      *)in_stack_fffffffffffff178);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&in_RDI[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffff178);
          Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffff180.m_matrix,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffff178);
          Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,unsigned_int>
                    (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                     (uint)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                     (uint)in_stack_fffffffffffff1a8);
          Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                     in_stack_fffffffffffff180.m_matrix,
                     (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                      *)in_stack_fffffffffffff178);
          local_9ac = local_24;
          while (pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (in_RDI,(ulong)local_9ac), *pvVar5 != 0) {
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(in_RDI + 0x1f),(ulong)local_9ac);
            Math::SpatialTransform::toMatrixTranspose(in_stack_fffffffffffff380);
            Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                       in_stack_fffffffffffff180.m_matrix,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffff178);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                      (in_stack_fffffffffffff180.m_matrix,
                       (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                        *)in_stack_fffffffffffff178);
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (in_RDI,(ulong)local_9ac);
            local_9ac = *pvVar5;
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_9ac);
            uVar3 = pvVar6->q_index;
            pvVar6 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)&in_RDI[6].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)local_9ac);
            if (pvVar6->mJointType == JointTypeCustom) {
              pvVar6 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)&in_RDI[6].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)local_9ac);
              if (pvVar6->mJointType == JointTypeCustom) {
                pvVar6 = std::
                         vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                       *)&in_RDI[6].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (ulong)local_9ac);
                uVar3 = pvVar6->custom_joint_index;
                std::
                vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                              *)&in_RDI[0x13].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           in_stack_fffffffffffff178);
                std::
                vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                              *)&in_RDI[0x13].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
                PVar11 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                         operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                    *)in_stack_fffffffffffff180.m_matrix,
                                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                   in_stack_fffffffffffff178);
                in_stack_fffffffffffff3a0 = (SpatialVector *)PVar11.m_rhs;
                Eigen::Matrix<double,-1,-1,0,-1,-1>::
                Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                          (in_stack_fffffffffffff180.m_matrix,
                           (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                            *)in_stack_fffffffffffff178);
                Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                          (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                           in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20)
                           ,(uint)in_stack_fffffffffffff1a8);
                Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           in_stack_fffffffffffff178);
                in_stack_fffffffffffff180 =
                     Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                in_stack_fffffffffffff178);
                Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                          (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                           in_stack_fffffffffffff1b0,
                           (uint)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                           (int)in_stack_fffffffffffff1a8);
                Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)in_stack_fffffffffffff178);
                Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                          ((Matrix<double,__1,__1,_0,__1,__1> *)0x81a593);
              }
            }
            else {
              pvVar6 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)&in_RDI[6].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)local_9ac);
              if (pvVar6->mDoFCount == 1) {
                local_b18 = (non_const_type)
                            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                       in_stack_fffffffffffff178);
                std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                          ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                           &in_RDI[7].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_9ac);
                PVar9 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                        operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                   *)in_stack_fffffffffffff180.m_matrix,
                                  (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                                  in_stack_fffffffffffff178);
                in_stack_fffffffffffff4f8 = (SpatialRigidBodyInertia *)PVar9.m_rhs;
                local_b10 = (non_const_type)PVar9.m_lhs.m_matrix;
                Eigen::Matrix<double,-1,-1,0,-1,-1>::
                Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                          (in_stack_fffffffffffff180.m_matrix,
                           (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                            *)in_stack_fffffffffffff178);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a024);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a039);
                Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
                          (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                           in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                           (long)in_stack_fffffffffffff1a0);
                Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           in_stack_fffffffffffff178);
                local_b58 = (non_const_type)
                            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                       in_stack_fffffffffffff178);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a0ec);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a101);
                Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
                          (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                           in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                           (long)in_stack_fffffffffffff1a0);
                Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                           in_stack_fffffffffffff180.m_matrix,
                           (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)in_stack_fffffffffffff178);
                Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                          ((Matrix<double,__1,__1,_0,__1,__1> *)0x81a157);
              }
              else {
                pvVar6 = std::
                         vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                       *)&in_RDI[6].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (ulong)local_9ac);
                if (pvVar6->mDoFCount == 3) {
                  in_stack_fffffffffffff208 =
                       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  in_stack_fffffffffffff178);
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)&in_RDI[0xe].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)local_9ac);
                  PVar10 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
                           ::operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                        *)in_stack_fffffffffffff180.m_matrix,
                                       (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                                       in_stack_fffffffffffff178);
                  in_stack_fffffffffffff200 = PVar10.m_lhs.m_matrix;
                  Eigen::Matrix<double,-1,-1,0,-1,-1>::
                  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                            (in_stack_fffffffffffff180.m_matrix,
                             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                              *)in_stack_fffffffffffff178);
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a296)
                  ;
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a2a5)
                  ;
                  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
                            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                             in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                             (long)in_stack_fffffffffffff1a0);
                  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                             in_stack_fffffffffffff180.m_matrix,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_fffffffffffff178);
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_fffffffffffff178);
                  in_stack_fffffffffffff1b0 = (ulong)uVar3;
                  in_stack_fffffffffffff1b8 = (ulong)uVar2;
                  in_stack_fffffffffffff1a0 = local_ba8;
                  in_stack_fffffffffffff1a8 = in_RDX;
                  in_stack_fffffffffffff1c0 =
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  0x81a33a);
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x81a349)
                  ;
                  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
                            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                             in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                             (long)in_stack_fffffffffffff1a0);
                  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                             in_stack_fffffffffffff180.m_matrix,
                             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              *)in_stack_fffffffffffff178);
                  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                            ((Matrix<double,__1,__1,_0,__1,__1> *)0x81a393);
                }
              }
            }
          }
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)0x81a5cc);
        }
      }
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void CompositeRigidBodyAlgorithm (
    Model& model,
    const VectorNd &Q,
    MatrixNd &H,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  assert (H.rows() == model.dof_count && H.cols() == model.dof_count);

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (update_kinematics) {
      jcalc_X_lambda_S (model, i, Q);
    }
    model.Ic[i] = model.I[i];
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if (model.lambda[i] != 0) {
      model.Ic[model.lambda[i]] = model.Ic[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.Ic[i]);
    }

    unsigned int dof_index_i = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1 
        && model.mJoints[i].mJointType != JointTypeCustom) {

      SpatialVector F             = model.Ic[i] * model.S[i];
      H(dof_index_i, dof_index_i) = model.S[i].dot(F);

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F = model.X_lambda[j].applyTranspose(F);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom) {
          if (model.mJoints[j].mDoFCount == 1) {
            H(dof_index_i,dof_index_j) = F.dot(model.S[j]);
            H(dof_index_j,dof_index_i) = H(dof_index_i,dof_index_j);
          } else if (model.mJoints[j].mDoFCount == 3) {
            Vector3d H_temp2 = 
              (F.transpose() * model.multdof3_S[j]).transpose();
            LOG << F.transpose() << std::endl 
              << model.multdof3_S[j] << std::endl;
            LOG << H_temp2.transpose() << std::endl;

            H.block<1,3>(dof_index_i,dof_index_j) = H_temp2.transpose();
            H.block<3,1>(dof_index_j,dof_index_i) = H_temp2;
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){        
          unsigned int k      = model.mJoints[j].custom_joint_index;
          unsigned int dof    = model.mCustomJoints[k]->mDoFCount;
          VectorNd H_temp2    =
            (F.transpose() * model.mCustomJoints[k]->S).transpose();

          LOG << F.transpose()
            << std::endl
            << model.mCustomJoints[j]->S << std::endl;

          LOG << H_temp2.transpose() << std::endl;

          H.block(dof_index_i,dof_index_j,1,dof) = H_temp2.transpose();
          H.block(dof_index_j,dof_index_i,dof,1) = H_temp2;
        }
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Matrix63 F_63 = model.Ic[i].toMatrix() * model.multdof3_S[i];
      H.block<3,3>(dof_index_i, dof_index_i) = model.multdof3_S[i].transpose() * F_63;

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F_63 = model.X_lambda[j].toMatrixTranspose() * (F_63);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom){
          if (model.mJoints[j].mDoFCount == 1) {
            Vector3d H_temp2 = F_63.transpose() * (model.S[j]);

            H.block<3,1>(dof_index_i,dof_index_j) = H_temp2;
            H.block<1,3>(dof_index_j,dof_index_i) = H_temp2.transpose();
          } else if (model.mJoints[j].mDoFCount == 3) {
            Matrix3d H_temp2 = F_63.transpose() * (model.multdof3_S[j]);

            H.block<3,3>(dof_index_i,dof_index_j) = H_temp2;
            H.block<3,3>(dof_index_j,dof_index_i) = H_temp2.transpose();
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){
          unsigned int k = model.mJoints[j].custom_joint_index;
          unsigned int dof = model.mCustomJoints[k]->mDoFCount;

          MatrixNd H_temp2 = F_63.transpose() * (model.mCustomJoints[k]->S);

          H.block(dof_index_i,dof_index_j,3,dof) = H_temp2;
          H.block(dof_index_j,dof_index_i,dof,3) = H_temp2.transpose();
        }
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {      
      unsigned int kI = model.mJoints[i].custom_joint_index;
      unsigned int dofI = model.mCustomJoints[kI]->mDoFCount;

      MatrixNd F_Nd = model.Ic[i].toMatrix()
        * model.mCustomJoints[kI]->S;

      H.block(dof_index_i, dof_index_i,dofI,dofI)
        = model.mCustomJoints[kI]->S.transpose() * F_Nd;

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F_Nd = model.X_lambda[j].toMatrixTranspose() * (F_Nd);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom){
          if (model.mJoints[j].mDoFCount == 1) {
            MatrixNd H_temp2 = F_Nd.transpose() * (model.S[j]);
            H.block(   dof_index_i,  dof_index_j,
                H_temp2.rows(),H_temp2.cols()) = H_temp2;
            H.block(dof_index_j,dof_index_i,
                H_temp2.cols(),H_temp2.rows()) = H_temp2.transpose();
          } else if (model.mJoints[j].mDoFCount == 3) {
            MatrixNd H_temp2 = F_Nd.transpose() * (model.multdof3_S[j]);
            H.block(dof_index_i,   dof_index_j,
                H_temp2.rows(),H_temp2.cols()) = H_temp2;
            H.block(dof_index_j,   dof_index_i,
                H_temp2.cols(),H_temp2.rows()) = H_temp2.transpose();
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){
          unsigned int k   = model.mJoints[j].custom_joint_index;
          unsigned int dof = model.mCustomJoints[k]->mDoFCount;

          MatrixNd H_temp2 = F_Nd.transpose() * (model.mCustomJoints[k]->S);

          H.block(dof_index_i,dof_index_j,3,dof) = H_temp2;
          H.block(dof_index_j,dof_index_i,dof,3) = H_temp2.transpose();
        }
      }
    }
  }
}